

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projections.c
# Opt level: O3

void icetProjectTile(IceTInt tile,IceTDouble *mat_out)

{
  int iVar1;
  int iVar2;
  IceTTimeStamp IVar3;
  IceTTimeStamp IVar4;
  IceTDouble *pIVar5;
  IceTInt *pIVar6;
  IceTDouble *pIVar7;
  IceTSizeType *pIVar8;
  long lVar9;
  byte bVar10;
  IceTInt num_tiles;
  IceTInt renderable_height;
  IceTInt renderable_width;
  IceTDouble tile_viewport_proj [16];
  IceTDouble viewport_proj [16];
  int local_144;
  int local_140;
  int local_13c;
  int local_138 [32];
  IceTDouble local_b8 [17];
  
  bVar10 = 0;
  IVar3 = icetStateGetTime(0x11);
  IVar4 = icetStateGetTime(0x94);
  if (IVar4 <= IVar3) {
    icetGetIntegerv(0x10,local_138);
    pIVar5 = icetStateAllocateDouble(0x94,local_138[0] << 4);
    pIVar6 = icetUnsafeStateGetInteger(0x11);
    if (0 < local_138[0]) {
      pIVar8 = pIVar6 + 3;
      lVar9 = 0;
      do {
        icetGetViewportProject(pIVar8[-3],pIVar8[-2],pIVar8[-1],*pIVar8,pIVar5);
        lVar9 = lVar9 + 1;
        pIVar5 = pIVar5 + 0x10;
        pIVar8 = pIVar8 + 4;
      } while (lVar9 < local_138[0]);
    }
  }
  icetGetIntegerv(0x10,&local_144);
  if ((tile < 0) || (local_144 <= tile)) {
    icetRaiseDiagnostic("Bad tile passed to icetProjectTile.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/projections.c"
                        ,0x29);
  }
  else {
    pIVar6 = icetUnsafeStateGetInteger(0x11);
    iVar1 = pIVar6[(ulong)(uint)(tile * 4) + 2];
    iVar2 = pIVar6[(ulong)(uint)(tile * 4) + 3];
    icetGetIntegerv(7,&local_13c);
    icetGetIntegerv(8,&local_140);
    pIVar5 = icetUnsafeStateGetDouble(0x94);
    if (local_140 == iVar2 && local_13c == iVar1) {
      pIVar5 = pIVar5 + (uint)(tile << 4);
      pIVar7 = (IceTDouble *)local_138;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        *pIVar7 = *pIVar5;
        pIVar5 = pIVar5 + (ulong)bVar10 * -2 + 1;
        pIVar7 = pIVar7 + (ulong)bVar10 * -2 + 1;
      }
    }
    else {
      icetMatrixOrtho(-1.0,(IceTDouble)
                           (((double)local_13c + (double)local_13c) / (double)iVar1 + -1.0),-1.0,
                      (IceTDouble)(((double)local_140 + (double)local_140) / (double)iVar2 + -1.0),
                      1.0,-1.0,local_b8);
      icetMatrixMultiply((IceTDouble *)local_138,local_b8,pIVar5 + (uint)(tile << 4));
    }
    pIVar5 = icetUnsafeStateGetDouble(0x81);
    icetMatrixMultiply(mat_out,(IceTDouble *)local_138,pIVar5);
  }
  return;
}

Assistant:

void icetProjectTile(IceTInt tile, IceTDouble *mat_out)
{
    IceTInt num_tiles;
    const IceTInt *viewports;
    const IceTDouble *tile_projections;
    IceTInt tile_width, tile_height;
    IceTInt renderable_width, renderable_height;
    const IceTDouble *tile_proj;
    IceTDouble tile_viewport_proj[16];
    const IceTDouble *global_proj;

  /* Update tile projections. */
    update_tile_projections();

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    if ((tile < 0) || (tile >= num_tiles)) {
        icetRaiseError("Bad tile passed to icetProjectTile.",
                       ICET_INVALID_VALUE);
        return;
    }

    viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    tile_width = viewports[tile*4+2];
    tile_height = viewports[tile*4+3];
    icetGetIntegerv(ICET_PHYSICAL_RENDER_WIDTH, &renderable_width);
    icetGetIntegerv(ICET_PHYSICAL_RENDER_HEIGHT, &renderable_height);
    tile_projections = icetUnsafeStateGetDouble(ICET_TILE_PROJECTIONS);

    tile_proj = tile_projections + 16*tile;

    if ((renderable_width != tile_width) || (renderable_height != tile_height)){
      /* Compensate for fact that tile is smaller than actual window.
         Use an orthographic projection to place the tile in the lower left
         corner of the tile. */
        IceTDouble viewport_proj[16];
        icetMatrixOrtho(-1.0, 2.0*renderable_width/tile_width - 1.0,
                        -1.0, 2.0*renderable_height/tile_height - 1.0,
                        1.0, -1.0, viewport_proj);

        icetMatrixMultiply(tile_viewport_proj,
                           (const IceTDouble *)viewport_proj,
                           (const IceTDouble *)tile_proj);
    } else {
        memcpy(tile_viewport_proj, (const IceTDouble*)tile_proj,
               16*sizeof(IceTDouble));
    }

  /* Project the user requested view to the tile projection. */
    global_proj = icetUnsafeStateGetDouble(ICET_PROJECTION_MATRIX);
    icetMatrixMultiply(mat_out,
                       (const IceTDouble *)tile_viewport_proj,
                       (const IceTDouble *)global_proj);
}